

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall FloatInterval_SumSquares_Test::TestBody(FloatInterval_SumSquares_Test *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  internal *this_00;
  char *pcVar7;
  float fVar8;
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  AssertHelper local_40;
  undefined8 local_38;
  float fStack_30;
  float fStack_2c;
  Message local_20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  undefined1 extraout_var_00 [56];
  
  local_20.ss_.ptr_._0_4_ = 1;
  local_40.data_._0_4_ = 1.0;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_38,"1","Float(SumSquares(a))",(int *)&local_20,(float *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_20);
    if ((undefined8 *)CONCAT44(fStack_2c,fStack_30) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT44(fStack_2c,fStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x316,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&fStack_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ss_.ptr_._0_4_ = 4;
  local_40.data_._0_4_ = 4.0;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_38,"4","Float(SumSquares(b))",(int *)&local_20,(float *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_20);
    if ((undefined8 *)CONCAT44(fStack_2c,fStack_30) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT44(fStack_2c,fStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x317,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&fStack_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ss_.ptr_._0_4_ = 5;
  auVar11._0_8_ =
       pbrt::SumSquares<float,pbrt::Interval<float>>
                 ((Interval<float>)0x3f8000003f800000,(Interval<float>)0x4000000040000000);
  auVar11._8_56_ = extraout_var;
  auVar10 = vhaddps_avx(auVar11._0_16_,auVar11._0_16_);
  local_40.data_._0_4_ = auVar10._0_4_ * 0.5;
  this_00 = (internal *)&local_38;
  testing::internal::CmpHelperEQ<int,float>
            (this_00,"5","Float(SumSquares(a, b))",(int *)&local_20,(float *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_20);
    if ((undefined8 *)CONCAT44(fStack_2c,fStack_30) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT44(fStack_2c,fStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x318,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&fStack_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.data_._0_4_ = 1.96182e-44;
  auVar9._0_8_ = pbrt::SumSquares<float,pbrt::Interval<float>>
                           ((Interval<float>)0x4000000040000000,(Interval<float>)0x4040000040400000)
  ;
  auVar9._8_56_ = extraout_var_00;
  local_38._0_4_ = auVar9._0_4_ + 1.0;
  auVar11 = ZEXT464((uint)(float)local_38);
  lVar5 = 4;
  local_38._4_4_ = (float)local_38;
  fStack_30 = (float)local_38;
  fStack_2c = (float)local_38;
  do {
    fVar1 = *(float *)((long)&local_38 + lVar5);
    fVar8 = auVar11._0_4_;
    auVar10 = vminss_avx(ZEXT416((uint)fVar1),auVar11._0_16_);
    auVar11 = ZEXT1664(auVar10);
    if (fVar1 < fVar8) {
      this_00 = (internal *)((long)&local_38 + lVar5);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  fVar1 = *(float *)this_00;
  auVar10 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar1) {
    auVar10._0_12_ = ZEXT812(0);
    auVar10._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar10,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar1 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar1);
    auVar10 = ZEXT416((int)fVar1 + -1 + (uint)(fVar1 <= 0.0) * 2);
  }
  auVar12 = vmovshdup_avx(auVar9._0_16_);
  local_38._0_4_ = auVar12._0_4_ + 1.0;
  auVar11 = ZEXT464((uint)(float)local_38);
  pfVar6 = (float *)&local_38;
  lVar5 = 4;
  local_38._4_4_ = (float)local_38;
  fStack_30 = (float)local_38;
  fStack_2c = (float)local_38;
  do {
    fVar1 = *(float *)((long)&local_38 + lVar5);
    fVar8 = auVar11._0_4_;
    auVar12 = vmaxss_avx(ZEXT416((uint)fVar1),auVar11._0_16_);
    auVar11 = ZEXT1664(auVar12);
    if (fVar8 < fVar1) {
      pfVar6 = (float *)((long)&local_38 + lVar5);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  fVar1 = *pfVar6;
  auVar12 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar1 < INFINITY) {
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar12,0);
    fVar1 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar1);
    auVar12 = ZEXT416((-(uint)(fVar1 < 0.0) | 1) + (int)fVar1);
  }
  auVar2 = vminss_avx(auVar12,auVar10);
  auVar10 = vmaxss_avx(auVar12,auVar10);
  auVar12 = vmaxss_avx(auVar2,ZEXT416(0) << 0x20);
  auVar2 = vminss_avx(auVar10,auVar12);
  auVar10 = vmaxss_avx(auVar10,auVar12);
  local_38._0_4_ = (auVar2._0_4_ + auVar10._0_4_) * 0.5;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_20,"14","Float(SumSquares(a, b, c))",(int *)&local_40,
             (float *)&local_38);
  if (local_20.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x319,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_38._4_4_,(float)local_38) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_38._4_4_,(float)local_38) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38._4_4_,(float)local_38) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FloatInterval, SumSquares) {
    {
        FloatInterval a(1), b(2), c(3);
        EXPECT_EQ(1, Float(SumSquares(a)));
        EXPECT_EQ(4, Float(SumSquares(b)));
        EXPECT_EQ(5, Float(SumSquares(a, b)));
        EXPECT_EQ(14, Float(SumSquares(a, b, c)));
    }
}